

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_redistribution.cpp
# Opt level: O1

void Redistribution::Apply
               (Box *bx,int ncomp,Array4<double> *dUdt_out,Array4<double> *dUdt_in,
               Array4<const_double> *U_in,Array4<double> *scratch,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *apx,
               Array4<const_double> *apy,Array4<const_double> *apz,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,BCRec *d_bcrec_ptr,Geometry *lev_geom,Real dt,
               string redistribution_type,int srd_max_order,Real target_volfrac,
               Array4<const_double> *srd_update_scale)

{
  undefined1 auVar1 [12];
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  double *pdVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  void *__s;
  int iVar33;
  int iVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  double *pdVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar53;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  bool bVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  bool bVar61;
  int iVar62;
  double *local_6a0;
  double *local_690;
  double *local_688;
  double *local_670;
  double *local_658;
  double *local_630;
  double *local_5f8;
  Array4<int> local_578;
  Box result;
  Array4<double> local_4d8;
  FArrayBox nrs_fab;
  IArrayBox itracker;
  FArrayBox cent_hat_fab;
  FArrayBox nbhd_vol_fab;
  FArrayBox alpha_fab;
  Array4<const_double> local_330;
  Array4<double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<double> local_270;
  Array4<const_double> local_230;
  Array4<double> local_1f0;
  Array4<const_double> local_1b0;
  Array4<const_int> local_170;
  Elixir eli_chf;
  Elixir eli_nbf;
  Elixir eli_alpha;
  Elixir eli_nrs;
  Elixir eli_itr;
  Box result_1;
  Box result_2;
  Array4<const_int> local_70;
  long lVar50;
  
  if (0 < ncomp) {
    lVar35 = dUdt_out->kstride;
    lVar9 = dUdt_out->nstride;
    iVar20 = (bx->smallend).vect[2];
    iVar4 = (dUdt_out->begin).y;
    iVar5 = (dUdt_out->begin).x;
    iVar33 = (bx->bigend).vect[2];
    iVar6 = (bx->bigend).vect[0];
    iVar45 = (bx->bigend).vect[1];
    iVar34 = (bx->smallend).vect[1];
    iVar21 = (bx->smallend).vect[0];
    local_690 = (double *)(long)iVar21;
    lVar42 = dUdt_out->jstride * 8;
    pdVar24 = dUdt_out->p;
    iVar25 = (dUdt_out->begin).z;
    uVar22 = 0;
    do {
      iVar30 = iVar20 - iVar25;
      iVar27 = iVar20;
      if (iVar20 <= iVar33) {
        do {
          if (iVar34 <= iVar45) {
            __s = (void *)((long)pdVar24 +
                          (iVar30 * lVar35 + (long)local_690) * 8 +
                          ((long)iVar34 - (long)iVar4) * lVar42 + (long)iVar5 * -8);
            iVar29 = (iVar45 - iVar34) + 1;
            do {
              if (iVar21 <= iVar6) {
                memset(__s,0,(ulong)(uint)(iVar6 - iVar21) * 8 + 8);
              }
              __s = (void *)((long)__s + lVar42);
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          bVar47 = iVar27 != iVar33;
          iVar30 = iVar30 + 1;
          iVar27 = iVar27 + 1;
        } while (bVar47);
      }
      uVar22 = uVar22 + 1;
      local_690 = (double *)((long)local_690 + lVar9);
    } while (uVar22 != (uint)ncomp);
  }
  iVar20 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
  if (iVar20 == 0) {
    itracker.super_BaseFab<int>._vptr_BaseFab = (_func_int **)dUdt_in->p;
    itracker.super_BaseFab<int>.super_DataAllocator.m_arena = (Arena *)dUdt_in->jstride;
    itracker.super_BaseFab<int>.dptr = (int *)dUdt_in->kstride;
    itracker.super_BaseFab<int>.domain.smallend.vect._0_8_ = dUdt_in->nstride;
    itracker.super_BaseFab<int>.domain.bigend.vect[1] = (dUdt_in->begin).z;
    itracker.super_BaseFab<int>.domain.smallend.vect[2] = (dUdt_in->begin).x;
    itracker.super_BaseFab<int>.domain.bigend.vect[0] = (dUdt_in->begin).y;
    itracker.super_BaseFab<int>.domain.bigend.vect[2] = (dUdt_in->end).x;
    itracker.super_BaseFab<int>.domain.btype.itype = (dUdt_in->end).y;
    itracker.super_BaseFab<int>.nvar = (dUdt_in->end).z;
    itracker.super_BaseFab<int>.truesize._0_4_ = dUdt_in->ncomp;
    nrs_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)scratch->p;
    nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena = (Arena *)scratch->jstride;
    nrs_fab.super_BaseFab<double>.dptr = (double *)scratch->kstride;
    nrs_fab.super_BaseFab<double>.domain.smallend.vect._0_8_ = scratch->nstride;
    nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] = (scratch->begin).z;
    nrs_fab.super_BaseFab<double>.domain.smallend.vect[2] = (scratch->begin).x;
    nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] = (scratch->begin).y;
    nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] = (scratch->end).x;
    nrs_fab.super_BaseFab<double>.domain.btype.itype = (scratch->end).y;
    nrs_fab.super_BaseFab<double>.nvar = (scratch->end).z;
    nrs_fab.super_BaseFab<double>.truesize._0_4_ = scratch->ncomp;
    amrex::apply_flux_redistribution
              (bx,dUdt_out,(Array4<const_double> *)&itracker,(Array4<const_double> *)&nrs_fab,0,
               ncomp,flag,vfrac,lev_geom);
  }
  else {
    iVar20 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
    if (iVar20 == 0) {
      iVar33 = (bx->smallend).vect[0];
      iVar20 = (bx->smallend).vect[1];
      iVar4 = (bx->smallend).vect[2];
      iVar6 = (bx->bigend).vect[0];
      iVar45 = (bx->bigend).vect[1];
      iVar5 = (bx->bigend).vect[2];
      uVar15 = *(undefined8 *)(bx->smallend).vect;
      uVar16 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar17 = *(undefined8 *)((bx->bigend).vect + 2);
      result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result.bigend.vect[2] = (int)uVar17;
      result.btype.itype = (uint)((ulong)uVar17 >> 0x20);
      result.smallend.vect[2] = (int)uVar16;
      result.bigend.vect[0] = (int)((ulong)uVar16 >> 0x20);
      result.smallend.vect[0] = (int)uVar15;
      result.smallend.vect[1] = (int)((ulong)uVar15 >> 0x20);
      result.smallend.vect[2] = result.smallend.vect[2] + -2;
      result.bigend.vect[0] = result.bigend.vect[0] + 2;
      result.smallend.vect[1] = result.smallend.vect[1] + -2;
      result.smallend.vect[0] = result.smallend.vect[0] + -2;
      result.bigend.vect[1] = result.bigend.vect[1] + 2;
      result.bigend.vect[2] = result.bigend.vect[2] + 2;
      uVar15 = *(undefined8 *)(bx->smallend).vect;
      uVar16 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar17 = *(undefined8 *)((bx->bigend).vect + 2);
      result_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result_1.bigend.vect[2] = (int)uVar17;
      result_1.btype.itype = (uint)((ulong)uVar17 >> 0x20);
      result_1.smallend.vect[2] = (int)uVar16;
      result_1.bigend.vect[0] = (int)((ulong)uVar16 >> 0x20);
      result_1.smallend.vect[0] = (int)uVar15;
      result_1.smallend.vect[1] = (int)((ulong)uVar15 >> 0x20);
      result_1.smallend.vect[2] = result_1.smallend.vect[2] + -3;
      result_1.bigend.vect[0] = result_1.bigend.vect[0] + 3;
      result_1.smallend.vect[1] = result_1.smallend.vect[1] + -3;
      result_1.smallend.vect[0] = result_1.smallend.vect[0] + -3;
      result_1.bigend.vect[1] = result_1.bigend.vect[1] + 3;
      result_1.bigend.vect[2] = result_1.bigend.vect[2] + 3;
      uVar15 = *(undefined8 *)(bx->smallend).vect;
      uVar16 = *(undefined8 *)((bx->smallend).vect + 2);
      auVar1 = *(undefined1 (*) [12])&bx->bigend;
      uVar2 = bx->btype;
      result_2.smallend.vect[2] = (int)uVar16;
      result_2.bigend.vect[0] = (int)((ulong)uVar16 >> 0x20);
      result_2.smallend.vect[0] = (int)uVar15;
      result_2.smallend.vect[1] = (int)((ulong)uVar15 >> 0x20);
      result_2.smallend.vect[2] = result_2.smallend.vect[2] + -4;
      result_2.bigend.vect[0] = result_2.bigend.vect[0] + 4;
      result_2.smallend.vect[1] = result_2.smallend.vect[1] + -4;
      result_2.smallend.vect[0] = result_2.smallend.vect[0] + -4;
      result_2.bigend.vect[1] = auVar1._4_4_ + 4;
      result_2.bigend.vect[2] = auVar1._8_4_ + 4;
      result_2.btype.itype = uVar2;
      amrex::IArrayBox::IArrayBox(&itracker,&result_2,8,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&nrs_fab,&result_1,1,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&alpha_fab,&result_1,2,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&nbhd_vol_fab,&result,1,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&cent_hat_fab,&result_1,3,true,false,(Arena *)0x0);
      if (itracker.super_BaseFab<int>.super_DataAllocator.m_arena == (Arena *)0x0) {
        itracker.super_BaseFab<int>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_itr,(void *)0x0,itracker.super_BaseFab<int>.super_DataAllocator.m_arena);
      lVar35 = (long)itracker.super_BaseFab<int>.domain.bigend.vect[1] + 1;
      iVar34 = (int)lVar35 - itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_578.p = itracker.super_BaseFab<int>.dptr;
      local_578.jstride =
           ((long)itracker.super_BaseFab<int>.domain.bigend.vect[0] -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[0]) + 1;
      local_578.kstride =
           (lVar35 - itracker.super_BaseFab<int>.domain.smallend.vect[1]) * local_578.jstride;
      local_170.nstride =
           ((long)itracker.super_BaseFab<int>.domain.bigend.vect[2] + 1) -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_578.nstride = local_578.kstride * local_170.nstride;
      local_578.begin.x = itracker.super_BaseFab<int>.domain.smallend.vect[0];
      local_578.begin.y = itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_578.begin.z = itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_578.end._0_8_ =
           (long)itracker.super_BaseFab<int>.domain.bigend.vect[0] + 1U & 0xffffffff |
           lVar35 << 0x20;
      local_578.end.z = (int)((long)itracker.super_BaseFab<int>.domain.bigend.vect[2] + 1);
      local_578.ncomp = itracker.super_BaseFab<int>.nvar;
      local_170.p = itracker.super_BaseFab<int>.dptr;
      local_170.kstride = iVar34 * local_578.jstride;
      local_170.nstride = local_170.kstride * local_170.nstride;
      local_170.begin.x = itracker.super_BaseFab<int>.domain.smallend.vect[0];
      local_170.begin.y = itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_170.begin.z = itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_170.ncomp = itracker.super_BaseFab<int>.nvar;
      local_170.jstride = local_578.jstride;
      local_170.end._0_8_ = local_578.end._0_8_;
      local_170.end.z = local_578.end.z;
      if (nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_nrs,(void *)0x0,nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena);
      lVar35 = (long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1;
      iVar34 = (int)lVar35 - nrs_fab.super_BaseFab<double>.domain.smallend.vect[1];
      local_4d8.p = nrs_fab.super_BaseFab<double>.dptr;
      local_4d8.jstride =
           ((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_4d8.kstride =
           (lVar35 - nrs_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_4d8.jstride;
      local_1b0.nstride =
           ((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_4d8.nstride = local_4d8.kstride * local_1b0.nstride;
      local_4d8.begin.x = nrs_fab.super_BaseFab<double>.domain.smallend.vect[0];
      local_4d8.begin.y = nrs_fab.super_BaseFab<double>.domain.smallend.vect[1];
      local_4d8.begin.z = nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_4d8.end._0_8_ =
           (long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           lVar35 << 0x20;
      local_4d8.end.z = (int)((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_4d8.ncomp = nrs_fab.super_BaseFab<double>.nvar;
      local_1b0.p = nrs_fab.super_BaseFab<double>.dptr;
      local_1b0.kstride = iVar34 * local_4d8.jstride;
      local_1b0.nstride = local_1b0.kstride * local_1b0.nstride;
      local_1b0.begin.x = nrs_fab.super_BaseFab<double>.domain.smallend.vect[0];
      local_1b0.begin.y = nrs_fab.super_BaseFab<double>.domain.smallend.vect[1];
      local_1b0.begin.z = nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_1b0.ncomp = nrs_fab.super_BaseFab<double>.nvar;
      local_1b0.jstride = local_4d8.jstride;
      local_1b0.end._0_8_ = local_4d8.end._0_8_;
      local_1b0.end.z = local_4d8.end.z;
      if (alpha_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        alpha_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_alpha,(void *)0x0,alpha_fab.super_BaseFab<double>.super_DataAllocator.m_arena)
      ;
      lVar35 = (long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1;
      local_1f0.p = alpha_fab.super_BaseFab<double>.dptr;
      local_230.jstride =
           ((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_1f0.kstride =
           (lVar35 - alpha_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_230.jstride;
      local_230.nstride =
           ((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_1f0.nstride = local_1f0.kstride * local_230.nstride;
      local_1f0.begin.z = alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_230.end._0_8_ =
           (long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           lVar35 << 0x20;
      local_230.end.z = (int)((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_1f0.ncomp = alpha_fab.super_BaseFab<double>.nvar;
      local_230.p = alpha_fab.super_BaseFab<double>.dptr;
      local_230.kstride =
           ((int)lVar35 - alpha_fab.super_BaseFab<double>.domain.smallend.vect[1]) *
           local_230.jstride;
      local_230.nstride = local_230.kstride * local_230.nstride;
      local_230.begin.z = alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_230.ncomp = alpha_fab.super_BaseFab<double>.nvar;
      local_1f0.jstride = local_230.jstride;
      local_1f0.end._0_8_ = local_230.end._0_8_;
      local_1f0.end.z = local_230.end.z;
      if (nbhd_vol_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        nbhd_vol_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_nbf,(void *)0x0,nbhd_vol_fab.super_BaseFab<double>.super_DataAllocator.m_arena
                );
      lVar35 = (long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1;
      local_270.p = nbhd_vol_fab.super_BaseFab<double>.dptr;
      local_2b0.jstride =
           ((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_270.kstride =
           (lVar35 - nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_2b0.jstride
      ;
      local_2b0.nstride =
           ((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_270.nstride = local_270.kstride * local_2b0.nstride;
      local_270.begin.z = nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_2b0.end._0_8_ =
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           lVar35 << 0x20;
      local_2b0.end.z = (int)((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_270.ncomp = nbhd_vol_fab.super_BaseFab<double>.nvar;
      local_2b0.p = nbhd_vol_fab.super_BaseFab<double>.dptr;
      local_2b0.kstride =
           ((int)lVar35 - nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[1]) *
           local_2b0.jstride;
      local_2b0.nstride = local_2b0.kstride * local_2b0.nstride;
      local_2b0.begin.z = nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_2b0.ncomp = nbhd_vol_fab.super_BaseFab<double>.nvar;
      local_270.jstride = local_2b0.jstride;
      local_270.end._0_8_ = local_2b0.end._0_8_;
      local_270.end.z = local_2b0.end.z;
      if (cent_hat_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        cent_hat_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      iVar30 = iVar33 + -1;
      iVar20 = iVar20 + -1;
      iVar4 = iVar4 + -1;
      amrex::Gpu::Elixir::Elixir
                (&eli_chf,(void *)0x0,cent_hat_fab.super_BaseFab<double>.super_DataAllocator.m_arena
                );
      auVar19 = _DAT_0069f900;
      auVar18 = _DAT_006979c0;
      lVar35 = (long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1;
      local_2f0.p = cent_hat_fab.super_BaseFab<double>.dptr;
      local_330.jstride =
           ((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_2f0.kstride =
           (lVar35 - cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_330.jstride
      ;
      local_330.nstride =
           ((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_2f0.nstride = local_2f0.kstride * local_330.nstride;
      local_2f0.begin.z = cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_330.end._0_8_ =
           (long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           lVar35 << 0x20;
      local_330.end.z = (int)((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_2f0.ncomp = cent_hat_fab.super_BaseFab<double>.nvar;
      local_330.p = cent_hat_fab.super_BaseFab<double>.dptr;
      local_330.kstride =
           ((int)lVar35 - cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[1]) *
           local_330.jstride;
      local_330.nstride = local_330.kstride * local_330.nstride;
      local_330.begin.z = cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_330.ncomp = cent_hat_fab.super_BaseFab<double>.nvar;
      bVar3 = (lev_geom->super_CoordSys).field_0x51;
      iVar29 = (lev_geom->domain).smallend.vect[0] - (uint)bVar3;
      lVar35 = (long)(lev_geom->domain).bigend.vect[0] + (ulong)bVar3;
      uVar28 = (uint)(byte)(lev_geom->super_CoordSys).field_0x52;
      iVar34 = (lev_geom->domain).smallend.vect[1] - uVar28;
      iVar27 = uVar28 + (lev_geom->domain).bigend.vect[1];
      uVar28 = (uint)(byte)(lev_geom->super_CoordSys).field_0x53;
      iVar25 = (lev_geom->domain).smallend.vect[2] - uVar28;
      iVar21 = uVar28 + (lev_geom->domain).bigend.vect[2];
      if ((((((iVar30 < iVar29) || (iVar20 < iVar34)) || (iVar4 < iVar25)) ||
           (((int)lVar35 <= iVar6 || (iVar27 <= iVar45)))) || (iVar21 <= iVar5)) && (0 < ncomp)) {
        iVar45 = iVar45 + 1;
        iVar5 = iVar5 + 1;
        lVar9 = dUdt_in->jstride;
        lVar42 = dUdt_in->kstride;
        lVar13 = dUdt_in->nstride;
        iVar7 = (dUdt_in->begin).y;
        iVar8 = (dUdt_in->begin).z;
        uVar28 = (iVar6 - iVar33) + 2;
        auVar60._0_8_ = (long)iVar30;
        auVar60._8_4_ = iVar30;
        auVar60._12_4_ = iVar30 >> 0x1f;
        auVar48._8_8_ = auVar60._8_8_ + 1;
        auVar48._0_8_ = auVar60._0_8_;
        auVar52._4_4_ = 0;
        auVar52._0_4_ = uVar28;
        auVar52._8_4_ = uVar28;
        auVar52._12_4_ = 0;
        auVar54._0_8_ = (long)iVar29;
        auVar54._8_4_ = iVar29;
        auVar54._12_4_ = iVar29 >> 0x1f;
        auVar55._8_4_ = (int)lVar35;
        auVar55._0_8_ = lVar35;
        auVar55._12_4_ = (int)((ulong)lVar35 >> 0x20);
        pdVar24 = dUdt_in->p + (1 - (long)(dUdt_in->begin).x);
        uVar22 = 0;
        auVar52 = auVar52 ^ _DAT_006979c0;
        auVar54 = auVar54 ^ _DAT_0069f900;
        auVar55 = auVar55 ^ _DAT_0069f900;
        do {
          iVar33 = iVar4;
          if (iVar4 <= iVar5) {
            do {
              if (iVar20 <= iVar45) {
                iVar29 = iVar20;
                do {
                  if (iVar30 <= iVar6 + 1) {
                    lVar35 = ((long)iVar29 - (long)iVar7) * lVar9 +
                             ((long)iVar33 - (long)iVar8) * lVar42 + (long)iVar30;
                    uVar39 = 0;
                    auVar49 = auVar48;
                    do {
                      bVar47 = false;
                      iVar57 = SUB164(auVar49 ^ auVar19,0);
                      iVar58 = SUB164(auVar49 ^ auVar19,4);
                      if (iVar25 <= iVar33) {
                        iVar53 = auVar55._4_4_;
                        bVar47 = iVar58 <= iVar53 && (iVar58 != iVar53 || iVar57 <= auVar55._0_4_);
                      }
                      auVar59._8_4_ = (int)uVar39;
                      auVar59._0_8_ = uVar39;
                      auVar59._12_4_ = (int)(uVar39 >> 0x20);
                      auVar60 = (auVar59 | _DAT_006979b0) ^ auVar18;
                      iVar53 = auVar52._4_4_;
                      iVar62 = auVar60._4_4_;
                      bVar61 = iVar53 < iVar62 || iVar62 == iVar53 && auVar52._0_4_ < auVar60._0_4_;
                      iVar53 = auVar54._4_4_;
                      bVar56 = (iVar58 < iVar53 || iVar29 < iVar34) ||
                               iVar58 == iVar53 && iVar57 < auVar54._0_4_;
                      if ((bool)(~bVar61 & bVar56 |
                                ((bVar61 || bVar56) | bVar47 & iVar29 <= iVar27 & iVar33 <= iVar21)
                                ^ 1U)) {
                        pdVar24[lVar35 + (uVar39 - 1)] = 0.0;
                        pdVar24[lVar35 + uVar39] = 0.0;
                      }
                      uVar39 = uVar39 + 2;
                      lVar50 = auVar49._8_8_;
                      auVar49._0_8_ = auVar49._0_8_ + 2;
                      auVar49._8_8_ = lVar50 + 2;
                    } while (((ulong)uVar28 + 2 & 0xfffffffffffffffe) != uVar39);
                  }
                  bVar47 = iVar29 != iVar45;
                  iVar29 = iVar29 + 1;
                } while (bVar47);
              }
              bVar47 = iVar33 != iVar5;
              iVar33 = iVar33 + 1;
            } while (bVar47);
          }
          uVar22 = uVar22 + 1;
          pdVar24 = pdVar24 + lVar13;
        } while (uVar22 != (uint)ncomp);
      }
      if (0 < ncomp) {
        iVar20 = (scratch->begin).z;
        iVar4 = (scratch->end).x;
        lVar35 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 8);
        lVar9 = scratch->jstride;
        lVar42 = scratch->kstride;
        lVar13 = U_in->jstride;
        lVar50 = dUdt_in->jstride;
        iVar5 = (scratch->begin).y;
        lVar23 = (long)iVar5;
        iVar33 = (scratch->begin).x;
        lVar31 = (long)iVar33;
        iVar6 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x24);
        lVar14 = scratch->nstride;
        iVar45 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x20);
        local_6a0 = dUdt_in->p +
                    (((lVar23 - (dUdt_in->begin).y) * lVar50 + lVar31) - (long)(dUdt_in->begin).x);
        lVar26 = dUdt_in->nstride;
        lVar38 = dUdt_in->kstride;
        iVar34 = (dUdt_in->begin).z;
        local_690 = U_in->p + (((lVar23 - (U_in->begin).y) * lVar13 + lVar31) -
                              (long)(U_in->begin).x);
        lVar40 = U_in->nstride;
        lVar10 = U_in->kstride;
        iVar21 = (U_in->begin).z;
        lVar11 = *(long *)redistribution_type.field_2._M_allocated_capacity;
        lVar12 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 0x10);
        iVar25 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x28);
        iVar27 = (scratch->end).z;
        iVar30 = (scratch->end).y;
        local_688 = scratch->p;
        uVar22 = 0;
        do {
          iVar29 = iVar20;
          if (iVar20 < iVar27) {
            do {
              if (iVar5 < iVar30) {
                lVar43 = (long)iVar29;
                pdVar46 = (double *)((lVar43 - iVar20) * lVar42 * 8 + (long)local_688);
                pdVar24 = (double *)((lVar43 - iVar34) * lVar38 * 8 + (long)local_6a0);
                pdVar36 = (double *)((lVar43 - iVar21) * lVar10 * 8 + (long)local_690);
                lVar44 = (lVar43 - iVar25) * lVar12 * 8 +
                         lVar31 * 8 + (lVar23 - iVar6) * lVar35 * 8 + (long)iVar45 * -8 + lVar11;
                lVar43 = lVar23;
                do {
                  if (iVar33 < iVar4) {
                    lVar41 = 0;
                    do {
                      dVar51 = 1.0;
                      if (lVar11 != 0) {
                        dVar51 = *(double *)(lVar44 + lVar41 * 8);
                      }
                      pdVar46[lVar41] = (pdVar24[lVar41] * dt) / dVar51 + pdVar36[lVar41];
                      lVar41 = lVar41 + 1;
                    } while (iVar4 - iVar33 != (int)lVar41);
                  }
                  lVar43 = lVar43 + 1;
                  pdVar46 = pdVar46 + lVar9;
                  pdVar24 = pdVar24 + lVar50;
                  pdVar36 = pdVar36 + lVar13;
                  lVar44 = lVar44 + lVar35 * 8;
                } while (iVar30 != (int)lVar43);
              }
              bVar47 = iVar29 != iVar27 + -1;
              iVar29 = iVar29 + 1;
            } while (bVar47);
          }
          uVar22 = uVar22 + 1;
          local_688 = local_688 + lVar14;
          local_6a0 = local_6a0 + lVar26;
          local_690 = local_690 + lVar40;
        } while (uVar22 != (uint)ncomp);
      }
      local_2f0.jstride = local_330.jstride;
      local_2f0.end._0_8_ = local_330.end._0_8_;
      local_2f0.end.z = local_330.end.z;
      MakeITracker(bx,apx,apy,apz,vfrac,&local_578,lev_geom,target_volfrac);
      local_70.p = local_578.p;
      local_70.jstride = local_578.jstride;
      local_70.kstride = local_578.kstride;
      local_70.nstride = local_578.nstride;
      local_70.begin.x = local_578.begin.x;
      local_70.begin.y = local_578.begin.y;
      local_70.begin.z = local_578.begin.z;
      local_70.end.x = local_578.end.x;
      local_70.end.y = local_578.end.y;
      local_70.end.z = local_578.end.z;
      local_70.ncomp = local_578.ncomp;
      MakeStateRedistUtils
                (bx,flag,vfrac,ccc,&local_70,&local_4d8,&local_1f0,&local_270,&local_2f0,lev_geom,
                 target_volfrac);
      StateRedistribute(bx,ncomp,dUdt_out,scratch,flag,vfrac,fcx,fcy,fcz,ccc,d_bcrec_ptr,&local_170,
                        &local_1b0,&local_230,&local_2b0,&local_330,lev_geom,
                        (int)redistribution_type._M_string_length);
      if (0 < ncomp) {
        lVar35 = dUdt_out->jstride;
        lVar9 = U_in->jstride;
        iVar20 = (bx->smallend).vect[1];
        lVar23 = (long)iVar20;
        iVar4 = (bx->smallend).vect[0];
        lVar31 = (long)iVar4;
        iVar5 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x24);
        lVar42 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 8);
        iVar33 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x20);
        lVar13 = dUdt_in->jstride;
        lVar50 = *(long *)redistribution_type.field_2._M_allocated_capacity;
        lVar14 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 0x10);
        iVar6 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x28);
        local_630 = dUdt_out->p +
                    (((lVar23 - (dUdt_out->begin).y) * lVar35 + lVar31) - (long)(dUdt_out->begin).x)
        ;
        lVar26 = dUdt_out->kstride;
        lVar38 = dUdt_out->nstride;
        iVar45 = (dUdt_out->begin).z;
        local_658 = U_in->p + (((lVar23 - (U_in->begin).y) * lVar9 + lVar31) - (long)(U_in->begin).x
                              );
        lVar40 = U_in->kstride;
        lVar10 = U_in->nstride;
        iVar34 = (U_in->begin).z;
        local_670 = dUdt_in->p +
                    (((lVar23 - (dUdt_in->begin).y) * lVar13 + lVar31) - (long)(dUdt_in->begin).x);
        lVar11 = dUdt_in->kstride;
        lVar12 = dUdt_in->nstride;
        iVar21 = (dUdt_in->begin).z;
        iVar25 = (bx->smallend).vect[2];
        iVar27 = (bx->bigend).vect[2];
        iVar30 = (bx->bigend).vect[0];
        iVar29 = (bx->bigend).vect[1];
        uVar22 = 0;
        do {
          iVar7 = iVar25;
          if (iVar25 <= iVar27) {
            do {
              if (iVar20 <= iVar29) {
                lVar43 = (long)iVar7;
                pdVar36 = (double *)((lVar43 - iVar34) * lVar40 * 8 + (long)local_658);
                pdVar46 = (double *)((lVar43 - iVar45) * lVar26 * 8 + (long)local_630);
                lVar32 = (lVar43 - iVar6) * lVar14 * 8 +
                         lVar31 * 8 + (lVar23 - iVar5) * lVar42 * 8 + (long)iVar33 * -8 + lVar50;
                pdVar24 = (double *)((lVar43 - iVar21) * lVar11 * 8 + (long)local_670);
                lVar44 = (long)local_4d8.p +
                         (lVar43 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                         lVar31 * 8 + (lVar23 - local_4d8.begin.y) * local_4d8.jstride * 8 +
                         (long)local_4d8.begin.x * -8;
                lVar41 = (long)local_578.p +
                         (lVar43 - local_578.begin.z) * local_578.kstride * 4 +
                         lVar31 * 4 + (lVar23 - local_578.begin.y) * local_578.jstride * 4 +
                         (long)local_578.begin.x * -4;
                lVar43 = lVar23;
                do {
                  if (iVar4 <= iVar30) {
                    lVar37 = 0;
                    do {
                      if ((0 < *(int *)(lVar41 + lVar37 * 4)) ||
                         (1.0 < *(double *)(lVar44 + lVar37 * 8))) {
                        dVar51 = 1.0;
                        if (lVar50 != 0) {
                          dVar51 = *(double *)(lVar32 + lVar37 * 8);
                        }
                        pdVar46[lVar37] = ((pdVar46[lVar37] - pdVar36[lVar37]) * dVar51) / dt;
                      }
                      else {
                        pdVar46[lVar37] = pdVar24[lVar37];
                      }
                      lVar37 = lVar37 + 1;
                    } while ((iVar30 - iVar4) + 1 != (int)lVar37);
                  }
                  lVar43 = lVar43 + 1;
                  pdVar36 = pdVar36 + lVar9;
                  pdVar46 = pdVar46 + lVar35;
                  lVar32 = lVar32 + lVar42 * 8;
                  pdVar24 = pdVar24 + lVar13;
                  lVar44 = lVar44 + local_4d8.jstride * 8;
                  lVar41 = lVar41 + local_578.jstride * 4;
                } while (iVar29 + 1 != (int)lVar43);
              }
              bVar47 = iVar7 != iVar27;
              iVar7 = iVar7 + 1;
            } while (bVar47);
          }
          uVar22 = uVar22 + 1;
          local_658 = local_658 + lVar10;
          local_630 = local_630 + lVar38;
          local_670 = local_670 + lVar12;
        } while (uVar22 != (uint)ncomp);
      }
      amrex::Gpu::Elixir::~Elixir(&eli_chf);
      amrex::Gpu::Elixir::~Elixir(&eli_nbf);
      amrex::Gpu::Elixir::~Elixir(&eli_alpha);
      amrex::Gpu::Elixir::~Elixir(&eli_nrs);
      amrex::Gpu::Elixir::~Elixir(&eli_itr);
      cent_hat_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      amrex::BaseFab<double>::clear(&cent_hat_fab.super_BaseFab<double>);
      nbhd_vol_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      amrex::BaseFab<double>::clear(&nbhd_vol_fab.super_BaseFab<double>);
      alpha_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      amrex::BaseFab<double>::clear(&alpha_fab.super_BaseFab<double>);
      nrs_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      amrex::BaseFab<double>::clear(&nrs_fab.super_BaseFab<double>);
      itracker.super_BaseFab<int>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074ec50;
      amrex::BaseFab<int>::clear(&itracker.super_BaseFab<int>);
    }
    else {
      iVar20 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
      if (iVar20 != 0) {
        amrex::Error_host("Not a legit redist_type");
        return;
      }
      if (0 < ncomp) {
        lVar35 = dUdt_out->jstride;
        lVar9 = dUdt_out->kstride;
        lVar42 = dUdt_out->nstride;
        iVar20 = (dUdt_out->begin).z;
        lVar13 = dUdt_in->jstride;
        lVar50 = dUdt_in->kstride;
        iVar4 = (bx->smallend).vect[1];
        lVar26 = (long)iVar4;
        iVar5 = (bx->smallend).vect[0];
        local_5f8 = dUdt_out->p +
                    (((lVar26 - (dUdt_out->begin).y) * lVar35 + (long)iVar5) -
                    (long)(dUdt_out->begin).x);
        lVar14 = dUdt_in->nstride;
        iVar33 = (dUdt_in->begin).z;
        pdVar24 = dUdt_in->p +
                  (((lVar26 - (dUdt_in->begin).y) * lVar13 + (long)iVar5) - (long)(dUdt_in->begin).x
                  );
        iVar6 = (bx->smallend).vect[2];
        iVar45 = (bx->bigend).vect[2];
        iVar34 = (bx->bigend).vect[0];
        iVar21 = (bx->bigend).vect[1];
        uVar22 = 0;
        do {
          iVar25 = iVar6;
          if (iVar6 <= iVar45) {
            do {
              if (iVar4 <= iVar21) {
                pdVar46 = (double *)(((long)iVar25 - (long)iVar20) * lVar9 * 8 + (long)local_5f8);
                pdVar36 = (double *)(((long)iVar25 - (long)iVar33) * lVar50 * 8 + (long)pdVar24);
                lVar38 = lVar26;
                do {
                  if (iVar5 <= iVar34) {
                    lVar40 = 0;
                    do {
                      pdVar46[lVar40] = pdVar36[lVar40];
                      lVar40 = lVar40 + 1;
                    } while ((iVar34 - iVar5) + 1 != (int)lVar40);
                  }
                  lVar38 = lVar38 + 1;
                  pdVar46 = pdVar46 + lVar35;
                  pdVar36 = pdVar36 + lVar13;
                } while (iVar21 + 1 != (int)lVar38);
              }
              bVar47 = iVar25 != iVar45;
              iVar25 = iVar25 + 1;
            } while (bVar47);
          }
          uVar22 = uVar22 + 1;
          local_5f8 = local_5f8 + lVar42;
          pdVar24 = pdVar24 + lVar14;
        } while (uVar22 != (uint)ncomp);
      }
    }
  }
  return;
}

Assistant:

void Redistribution::Apply ( Box const& bx, int ncomp,
                             Array4<Real      > const& dUdt_out,
                             Array4<Real      > const& dUdt_in,
                             Array4<Real const> const& U_in,
                             Array4<Real> const& scratch,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL(Array4<Real const> const& apx,
                                          Array4<Real const> const& apy,
                                          Array4<Real const> const& apz),
                             Array4<amrex::Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             amrex::BCRec  const* d_bcrec_ptr,
                             Geometry const& lev_geom, Real dt,
                             std::string redistribution_type,
                             const int srd_max_order,
                             amrex::Real target_volfrac,
                             Array4<Real const> const& srd_update_scale)
{
    // redistribution_type = "NoRedist";       // no redistribution
    // redistribution_type = "FluxRedist"      // flux_redistribute
    // redistribution_type = "StateRedist";    // (weighted) state redistribute

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            dUdt_out(i,j,k,n) = 0.;
        });

    if (redistribution_type == "FluxRedist")
    {
        int icomp = 0;
        apply_flux_redistribution (bx, dUdt_out, dUdt_in, scratch, icomp, ncomp, flag, vfrac, lev_geom);

    } else if (redistribution_type == "StateRedist") {

        Box const& bxg1 = grow(bx,1);
        Box const& bxg2 = grow(bx,2);
        Box const& bxg3 = grow(bx,3);
        Box const& bxg4 = grow(bx,4);

#if (AMREX_SPACEDIM == 2)
        // We assume that in 2D a cell will only need at most 3 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,4);
        // How many nbhds is a cell in
#else
        // We assume that in 3D a cell will only need at most 7 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,8);
#endif
        FArrayBox nrs_fab(bxg3,1);
        FArrayBox alpha_fab(bxg3,2);

        // Total volume of all cells in my nbhd
        FArrayBox nbhd_vol_fab(bxg2,1);

        // Centroid of my nbhd
        FArrayBox cent_hat_fab     (bxg3,AMREX_SPACEDIM);

        Elixir eli_itr = itracker.elixir();
        Array4<int> itr = itracker.array();
        Array4<int const> itr_const = itracker.const_array();

        Elixir eli_nrs = nrs_fab.elixir();
        Array4<Real      > nrs       = nrs_fab.array();
        Array4<Real const> nrs_const = nrs_fab.const_array();

        Elixir eli_alpha = alpha_fab.elixir();
        Array4<Real      > alpha       = alpha_fab.array();
        Array4<Real const> alpha_const = alpha_fab.const_array();

        Elixir eli_nbf = nbhd_vol_fab.elixir();
        Array4<Real      > nbhd_vol       = nbhd_vol_fab.array();
        Array4<Real const> nbhd_vol_const = nbhd_vol_fab.const_array();

        Elixir eli_chf = cent_hat_fab.elixir();
        Array4<Real      > cent_hat       = cent_hat_fab.array();
        Array4<Real const> cent_hat_const = cent_hat_fab.const_array();

        Box domain_per_grown = lev_geom.Domain();
        AMREX_D_TERM(if (lev_geom.isPeriodic(0)) domain_per_grown.grow(0,1);,
                     if (lev_geom.isPeriodic(1)) domain_per_grown.grow(1,1);,
                     if (lev_geom.isPeriodic(2)) domain_per_grown.grow(2,1););

        // At any external Dirichlet domain boundaries we need to set dUdt_in to 0
        //    in the cells just outside the domain because those values will be used
        //    in the slope computation in state redistribution.  We assume here that
        //    the ext_dir values of U_in itself have already been set.
        if (!domain_per_grown.contains(bxg1))
            amrex::ParallelFor(bxg1,ncomp,
            [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))))
                        dUdt_in(i,j,k,n) = 0.;
                });

        amrex::ParallelFor(Box(scratch), ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);
                scratch(i,j,k,n) = U_in(i,j,k,n) + dt * dUdt_in(i,j,k,n) / scale;
            }
        );

        MakeITracker(bx, AMREX_D_DECL(apx, apy, apz), vfrac, itr, lev_geom, target_volfrac);

        MakeStateRedistUtils(bx, flag, vfrac, ccc, itr, nrs, alpha, nbhd_vol, cent_hat,
                             lev_geom, target_volfrac);

        StateRedistribute(bx, ncomp, dUdt_out, scratch, flag, vfrac,
                          AMREX_D_DECL(fcx, fcy, fcz), ccc,  d_bcrec_ptr,
                          itr_const, nrs_const, alpha_const, nbhd_vol_const,
                          cent_hat_const, lev_geom, srd_max_order);

        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                // Only update the values which actually changed -- this makes
                // the results insensitive to tiling -- otherwise cells that aren't
                // changed but are in a tile on which StateRedistribute gets called
                // will have precision-level changes due to adding/subtracting U_in
                // and multiplying/dividing by dt.   Here we test on whether (i,j,k)
                // has at least one neighbor and/or whether (i,j,k) is in the
                // neighborhood of another cell -- if either of those is true the
                // value may have changed

                if (itr(i,j,k,0) > 0 || nrs(i,j,k) > 1.)
                {
                   const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);

                   dUdt_out(i,j,k,n) = scale * (dUdt_out(i,j,k,n) - U_in(i,j,k,n)) / dt;

                }
                else
                {
                   dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
                }
            }
        );

    } else if (redistribution_type == "NoRedist") {
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
            }
        );

    } else {
       amrex::Error("Not a legit redist_type");
    }
}